

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lb.cpp
# Opt level: O2

void __thiscall zmq::lb_t::attach(lb_t *this,pipe_t *pipe_)

{
  array_t<zmq::pipe_t,_2>::push_back(&this->_pipes,pipe_);
  activated(this,pipe_);
  return;
}

Assistant:

void zmq::lb_t::attach (pipe_t *pipe_)
{
    _pipes.push_back (pipe_);
    activated (pipe_);
}